

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall Js::JSONStringifier::ReadData(JSONStringifier *this,Var value,JSONProperty *prop)

{
  char *addr;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  charcount_t cVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  Type TVar9;
  
  bVar3 = VarIs<Js::RecyclableObject>(value);
  if (bVar3) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(value);
  }
  else {
    pRVar6 = (RecyclableObject *)0x0;
  }
  if (pRVar6 != (RecyclableObject *)0x0) {
    ReadData(this,pRVar6,prop);
    return;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b76e53;
    *puVar7 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b76e53;
    *puVar7 = 0;
  }
  TVar9 = TypeIds_FirstNumberType;
  if ((((ulong)value & 0xffff000000000000) != 0x1000000000000) &&
     (TVar9 = TypeIds_Number, (ulong)value >> 0x32 == 0)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(value);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00b76e53;
      *puVar7 = 0;
    }
    TVar9 = ((pRVar6->type).ptr)->typeId;
    if (0x57 < (int)TVar9) {
      BVar4 = RecyclableObject::IsExternal(pRVar6);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00b76e53;
        *puVar7 = 0;
      }
    }
  }
  if (TVar9 != TypeIds_Number) {
    if (TVar9 == TypeIds_FirstNumberType) {
      prop->type = Number;
      Memory::Recycler::WBSetBit((char *)&(prop->field_1).obj);
      (prop->field_1).numericValue.value.ptr = value;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&prop->field_1);
      pJVar8 = ScriptContext::GetIntegerString(this->scriptContext,value);
      addr = (char *)((long)&prop->field_1 + 8);
      Memory::Recycler::WBSetBit(addr);
      (prop->field_1).numericValue.string.ptr = pJVar8;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      uVar1 = this->totalStringLength;
      cVar5 = JavascriptString::GetLength((prop->field_1).numericValue.string.ptr);
      if (CARRY4(cVar5,uVar1)) {
        ::Math::DefaultOverflowPolicy();
      }
      this->totalStringLength = cVar5 + uVar1;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                  ,0x328,"((0))","(0)");
      if (!bVar3) {
LAB_00b76e53:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      prop->type = Undefined;
    }
    return;
  }
  if ((ulong)value >> 0x32 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar3) goto LAB_00b76e53;
    *puVar7 = 0;
  }
  SetNumericProperty(this,(double)((ulong)value ^ 0xfffc000000000000),value,prop);
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ Var value, _Out_ JSONProperty* prop)
{
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    if (valueObj != nullptr)
    {
        ReadData(valueObj, prop);
        return;
    }

    // If value isn't a RecyclableObject, it must be a tagged number

    TypeId typeId = JavascriptOperators::GetTypeId(value);
    switch (typeId)
    {
    case TypeIds_Integer:
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = value;
        prop->numericValue.string = this->scriptContext->GetIntegerString(value);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
        return;
    }
#if FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(value), value, prop);
        return;
#endif
    default:
        Assume(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}